

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

int cmsys::SystemTools::Strucmp(char *s1,char *s2)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  
  lVar5 = 0;
  while( true ) {
    iVar4 = (int)s1[lVar5];
    cVar1 = s2[lVar5];
    if (s1[lVar5] == '\0') break;
    iVar2 = tolower(iVar4);
    iVar3 = tolower((int)cVar1);
    if (iVar2 != iVar3) goto LAB_0010e643;
    lVar5 = lVar5 + 1;
  }
  iVar4 = 0;
LAB_0010e643:
  iVar4 = tolower(iVar4);
  iVar2 = tolower((int)cVar1);
  return iVar4 - iVar2;
}

Assistant:

int SystemTools::Strucmp(const char *s1, const char *s2)
{
  // lifted from Graphvis http://www.graphviz.org
  while ((*s1 != '\0')
         && (tolower(*s1) == tolower(*s2)))
    {
      s1++;
      s2++;
    }

  return tolower(*s1) - tolower(*s2);
}